

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int begin_set_incoming_window(BEGIN_HANDLE begin,uint32_t incoming_window_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  BEGIN_INSTANCE *begin_instance;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    iVar2 = 0xb2a;
  }
  else {
    item_value = amqpvalue_create_uint(incoming_window_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0xb32;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,2,item_value);
      iVar2 = 0xb38;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int begin_set_incoming_window(BEGIN_HANDLE begin, uint32_t incoming_window_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE incoming_window_amqp_value = amqpvalue_create_uint(incoming_window_value);
        if (incoming_window_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 2, incoming_window_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(incoming_window_amqp_value);
        }
    }

    return result;
}